

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQInteger __thiscall
SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name,bool assignable)

{
  SQUnsignedInteger *pSVar1;
  SQLocalVarInfo *pSVar2;
  uint uVar3;
  SQLocalVarInfo *p;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  SQObjectPtr local_38;
  size_type local_28;
  undefined4 uStack_24;
  uint local_20;
  bool local_1c;
  
  uVar4 = (this->_vlocals)._size;
  uVar5 = (ulong)uVar4;
  uStack_24 = 0;
  local_38.super_SQObject._type = name->_type;
  local_38.super_SQObject._flags = name->_flags;
  local_38.super_SQObject._5_3_ = *(undefined3 *)&name->field_0x5;
  local_38.super_SQObject._unVal = (SQObjectValue)(name->_unVal).pTable;
  if ((local_38.super_SQObject._0_8_ & 0x8000000) != 0) {
    pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  local_28 = (this->_instructions)._size;
  uVar3 = (this->_vlocals)._allocated;
  p = (this->_vlocals)._vals;
  local_20 = uVar4;
  local_1c = assignable;
  if (uVar3 <= uVar4) {
    uVar6 = 4;
    if (uVar4 * 2 != 0) {
      uVar6 = (ulong)(uVar4 * 2);
    }
    p = (SQLocalVarInfo *)sq_vm_realloc((this->_vlocals)._alloc_ctx,p,(ulong)uVar3 << 5,uVar6 << 5);
    (this->_vlocals)._vals = p;
    (this->_vlocals)._allocated = (size_type)uVar6;
    uVar4 = (this->_vlocals)._size;
  }
  (this->_vlocals)._size = uVar4 + 1;
  pSVar2 = p + uVar4;
  (pSVar2->_name).super_SQObject._type = 0;
  (pSVar2->_name).super_SQObject._flags = '\0';
  *(undefined3 *)&(pSVar2->_name).super_SQObject.field_0x5 = 0;
  (pSVar2->_name).super_SQObject._unVal.pTable = (SQTable *)0x0;
  p[uVar4]._name.super_SQObject._type = OT_NULL;
  pSVar2 = p + uVar4;
  (pSVar2->_name).super_SQObject._type = local_38.super_SQObject._type;
  (pSVar2->_name).super_SQObject._flags = local_38.super_SQObject._flags;
  *(undefined3 *)&(pSVar2->_name).super_SQObject.field_0x5 = local_38.super_SQObject._5_3_;
  (pSVar2->_name).super_SQObject._unVal.pTable = (SQTable *)local_38.super_SQObject._unVal;
  if ((p[uVar4]._name.super_SQObject._type & 0x8000000) != 0) {
    pSVar1 = &((p[uVar4]._name.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
              .super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  p[uVar4]._start_op = local_28;
  p[uVar4]._end_op = uStack_24;
  p[uVar4]._pos = local_20;
  p[uVar4]._assignable = local_1c;
  uVar6 = (ulong)(this->_vlocals)._size;
  if ((ulong)this->_stacksize < uVar6) {
    this->_stacksize = uVar6;
  }
  SQObjectPtr::~SQObjectPtr(&local_38);
  return uVar5;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name, bool assignable)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    lvi._assignable=assignable;
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}